

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O2

void duckdb_brotli::BrotliStoreUncompressedMetaBlock
               (int is_final_block,uint8_t *input,size_t position,size_t mask,size_t len,
               size_t *storage_ix,uint8_t *storage)

{
  uint8_t *puVar1;
  size_t __n;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t nlenbits;
  uint64_t lenbits;
  uint64_t nibblesbits;
  
  uVar2 = position & mask;
  uVar4 = *storage_ix;
  *(ulong *)(storage + (uVar4 >> 3)) = (ulong)storage[uVar4 >> 3];
  uVar5 = uVar4 + 1;
  *storage_ix = uVar5;
  BrotliEncodeMlen(len,&lenbits,&nlenbits,&nibblesbits);
  *(uint64_t *)(storage + (uVar5 >> 3)) =
       nibblesbits << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
  uVar4 = uVar4 + 3;
  uVar5 = uVar4 + nlenbits;
  *(uint64_t *)(storage + (uVar4 >> 3)) = lenbits << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
  *(ulong *)(storage + (uVar5 >> 3)) = (ulong)storage[uVar5 >> 3] | 1L << ((byte)uVar5 & 7);
  uVar3 = (int)uVar5 + 8;
  uVar5 = (ulong)(uVar3 & 0xfffffff8);
  uVar4 = (ulong)(uVar3 >> 3);
  storage[uVar4] = '\0';
  if (mask + 1 < uVar2 + len) {
    __n = (mask + 1) - uVar2;
    switchD_00917c1c::default(storage + uVar4,input + uVar2,__n);
    uVar5 = uVar5 + __n * 8;
    len = len - __n;
    uVar4 = uVar5 >> 3;
    uVar2 = 0;
  }
  switchD_00917c1c::default(storage + uVar4,input + uVar2,len);
  uVar5 = uVar5 + len * 8;
  *storage_ix = uVar5;
  storage[uVar5 >> 3] = '\0';
  if (is_final_block != 0) {
    puVar1 = storage + (uVar5 >> 3);
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    uVar4 = uVar5 + 1 >> 3;
    *(ulong *)(storage + uVar4) = (ulong)storage[uVar4] | 1L << ((byte)(uVar5 + 1) & 7);
    *storage_ix = (ulong)((int)uVar5 + 8);
    storage[(int)uVar5 + 9U >> 3] = '\0';
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliStoreUncompressedMetaBlock(BROTLI_BOOL is_final_block,
                                      const uint8_t* BROTLI_RESTRICT input,
                                      size_t position, size_t mask,
                                      size_t len,
                                      size_t* BROTLI_RESTRICT storage_ix,
                                      uint8_t* BROTLI_RESTRICT storage) {
  size_t masked_pos = position & mask;
  BrotliStoreUncompressedMetaBlockHeader(len, storage_ix, storage);
  JumpToByteBoundary(storage_ix, storage);

  if (masked_pos + len > mask + 1) {
    size_t len1 = mask + 1 - masked_pos;
    memcpy(&storage[*storage_ix >> 3], &input[masked_pos], len1);
    *storage_ix += len1 << 3;
    len -= len1;
    masked_pos = 0;
  }
  memcpy(&storage[*storage_ix >> 3], &input[masked_pos], len);
  *storage_ix += len << 3;

  /* We need to clear the next 4 bytes to continue to be
     compatible with BrotliWriteBits. */
  BrotliWriteBitsPrepareStorage(*storage_ix, storage);

  /* Since the uncompressed block itself may not be the final block, add an
     empty one after this. */
  if (is_final_block) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    JumpToByteBoundary(storage_ix, storage);
  }
}